

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O3

Token * __thiscall enact::Lexer::scanToken(Token *__return_storage_ptr__,Lexer *this)

{
  size_t sVar1;
  byte bVar2;
  ulong uVar3;
  pointer pcVar4;
  short sVar5;
  TokenType type;
  string errorMessage;
  long *local_48;
  long local_40;
  long local_38 [2];
  
  skipWhitespace(this);
  uVar3 = this->m_current;
  this->m_start = uVar3;
  if (uVar3 < (this->m_source)._M_string_length) {
    sVar5 = (short)*(undefined4 *)&this->m_col;
    this->m_col = sVar5 + 1;
    sVar1 = uVar3 + 1;
    this->m_current = sVar1;
    pcVar4 = (this->m_source)._M_dataplus._M_p;
    bVar2 = pcVar4[uVar3];
    if ((byte)(bVar2 - 0x30) < 10) {
      number(__return_storage_ptr__,this);
      return __return_storage_ptr__;
    }
    if ((bVar2 == 0x5f) || ((byte)((bVar2 & 0xdf) + 0xbf) < 0x1a)) {
      identifier(__return_storage_ptr__,this);
      return __return_storage_ptr__;
    }
    if (bVar2 < 0x5d) {
      switch(bVar2) {
      case 0x21:
        type = BANG;
        if (pcVar4[sVar1] == '=') {
          this->m_col = sVar5 + 2;
          this->m_current = uVar3 + 2;
          type = BANG_EQUAL;
        }
        break;
      case 0x22:
switchD_00114d13_caseD_22:
        string(__return_storage_ptr__,this);
        return __return_storage_ptr__;
      case 0x23:
        type = HASH;
        break;
      case 0x24:
        type = DOLLAR;
        break;
      case 0x25:
      case 0x30:
      case 0x31:
      case 0x32:
      case 0x33:
      case 0x34:
      case 0x35:
      case 0x36:
      case 0x37:
      case 0x38:
      case 0x39:
      case 0x3a:
switchD_00114d13_caseD_25:
        local_48 = local_38;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_48,"Unrecognized character \'","");
        std::__cxx11::string::push_back((char)&local_48);
        std::__cxx11::string::append((char *)&local_48);
        __return_storage_ptr__->type = ERROR;
        (__return_storage_ptr__->lexeme)._M_dataplus._M_p =
             (pointer)&(__return_storage_ptr__->lexeme).field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&__return_storage_ptr__->lexeme,local_48,local_40 + (long)local_48);
        __return_storage_ptr__->line = this->m_line;
        __return_storage_ptr__->col = this->m_col;
        if (local_48 == local_38) {
          return __return_storage_ptr__;
        }
        operator_delete(local_48,local_38[0] + 1);
        return __return_storage_ptr__;
      case 0x26:
        type = AMPERSAND;
        break;
      case 0x27:
        type = APOSTROPHE;
        break;
      case 0x28:
        type = LEFT_PAREN;
        break;
      case 0x29:
        if (0 < this->m_currentInterpolations) {
          this->m_currentInterpolations = this->m_currentInterpolations + -1;
          goto switchD_00114d13_caseD_22;
        }
        type = RIGHT_PAREN;
        break;
      case 0x2a:
        type = STAR;
        break;
      case 0x2b:
        type = PLUS;
        break;
      case 0x2c:
        type = COMMA;
        break;
      case 0x2d:
        type = MINUS;
        break;
      case 0x2e:
        if (pcVar4[sVar1] == '.') {
          this->m_col = sVar5 + 2;
          this->m_current = uVar3 + 2;
          if (pcVar4[uVar3 + 2] == '.') {
            this->m_col = sVar5 + 3;
            this->m_current = uVar3 + 3;
            type = DOT_DOT_DOT;
          }
          else {
            type = DOT_DOT;
          }
        }
        else {
          type = DOT;
        }
        break;
      case 0x2f:
        type = SLASH;
        break;
      case 0x3b:
        type = SEMICOLON;
        break;
      case 0x3c:
        if (pcVar4[sVar1] == '<') {
          this->m_col = sVar5 + 2;
          this->m_current = uVar3 + 2;
          type = LESS_LESS;
        }
        else if (pcVar4[sVar1] == '=') {
          this->m_col = sVar5 + 2;
          this->m_current = uVar3 + 2;
          type = LESS_EQUAL;
        }
        else {
          type = LESS;
        }
        break;
      case 0x3d:
        if (pcVar4[sVar1] == '>') {
          this->m_col = sVar5 + 2;
          this->m_current = uVar3 + 2;
          type = EQUAL_GREATER;
        }
        else if (pcVar4[sVar1] == '=') {
          this->m_col = sVar5 + 2;
          this->m_current = uVar3 + 2;
          type = EQUAL_EQUAL;
        }
        else {
          type = EQUAL;
        }
        break;
      case 0x3e:
        if (pcVar4[sVar1] == '>') {
          this->m_col = sVar5 + 2;
          this->m_current = uVar3 + 2;
          type = GREATER_GREATER;
        }
        else if (pcVar4[sVar1] == '=') {
          this->m_col = sVar5 + 2;
          this->m_current = uVar3 + 2;
          type = GREATER_EQUAL;
        }
        else {
          type = GREATER;
        }
        break;
      case 0x3f:
        type = QUESTION;
        break;
      default:
        if (bVar2 != 0x5b) goto switchD_00114d13_caseD_25;
        type = LEFT_SQUARE;
      }
    }
    else {
      switch(bVar2) {
      case 0x7b:
        type = LEFT_BRACE;
        break;
      case 0x7c:
        type = PIPE;
        break;
      case 0x7d:
        type = RIGHT_BRACE;
        break;
      case 0x7e:
        type = TILDE;
        break;
      default:
        if (bVar2 == 0x5d) {
          type = RIGHT_SQUARE;
        }
        else {
          if (bVar2 != 0x5e) goto switchD_00114d13_caseD_25;
          type = CARAT;
        }
      }
    }
  }
  else {
    type = END_OF_FILE;
  }
  makeToken(__return_storage_ptr__,this,type);
  return __return_storage_ptr__;
}

Assistant:

Token Lexer::scanToken() {
        skipWhitespace();
        m_start = m_current;

        if (isAtEnd()) return makeToken(TokenType::END_OF_FILE);

        char c = advance();

        if (isDigit(c)) return number();
        if (isIdentifierStart(c)) return identifier();

        switch (c) {
            // Single character tokens.
            case '(':
                return makeToken(TokenType::LEFT_PAREN);
            case ')':
                if (m_currentInterpolations > 0) {
                    return interpolationEnd();
                }
                return makeToken(TokenType::RIGHT_PAREN);
            case '{':
                return makeToken(TokenType::LEFT_BRACE);
            case '}':
                return makeToken(TokenType::RIGHT_BRACE);
            case '[':
                return makeToken(TokenType::LEFT_SQUARE);
            case ']':
                return makeToken(TokenType::RIGHT_SQUARE);
            case '&':
                return makeToken(TokenType::AMPERSAND);
            case '\'':
                return makeToken(TokenType::APOSTROPHE);
            case '^':
                return makeToken(TokenType::CARAT);
            case ',':
                return makeToken(TokenType::COMMA);
            case '$':
                return makeToken(TokenType::DOLLAR);
            case '#':
                return makeToken(TokenType::HASH);
            case '-':
                return makeToken(TokenType::MINUS);
            case '|':
                return makeToken(TokenType::PIPE);
            case '+':
                return makeToken(TokenType::PLUS);
            case '?':
                return makeToken(TokenType::QUESTION);
            case ';':
                return makeToken(TokenType::SEMICOLON);
            case '/':
                return makeToken(TokenType::SLASH);
            case '*':
                return makeToken(TokenType::STAR);
            case '~':
                return makeToken(TokenType::TILDE);

            // 1 or 2 character tokens.
            case '!':
                return makeToken(match('=') ? TokenType::BANG_EQUAL : TokenType::BANG);
            case '=':
                if (match('=')) {
                    return makeToken(TokenType::EQUAL_EQUAL);
                }
                if (match('>')) {
                    return makeToken(TokenType::EQUAL_GREATER);
                }
                return makeToken(TokenType::EQUAL);
            case '>':
                if (match('=')) {
                    return makeToken(TokenType::GREATER_EQUAL);
                }
                if (match('>')) {
                    return makeToken(TokenType::GREATER_GREATER);
                }
                return makeToken(TokenType::GREATER);
            case '<':
                if (match('=')) {
                    return makeToken(TokenType::LESS_EQUAL);
                }
                if (match('<')) {
                    return makeToken(TokenType::LESS_LESS);
                }
                return makeToken(TokenType::LESS);

            // 1, 2 or 3 character tokens.
            case '.':
                if (match('.')) {
                    if (match('.')) {
                        return makeToken(TokenType::DOT_DOT_DOT);
                    }
                    return makeToken(TokenType::DOT_DOT);
                }
                return makeToken(TokenType::DOT);

            case '"':
                return string();
        }

        std::string errorMessage = "Unrecognized character '";
        errorMessage.push_back(c);
        errorMessage.append("'.");
        return errorToken(errorMessage);
    }